

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O3

HPDF_Font HPDF_Type0Font_New(HPDF_MMgr mmgr,HPDF_FontDef_conflict fontdef,HPDF_Encoder encoder,
                            HPDF_Xref xref)

{
  byte *pbVar1;
  void *pvVar2;
  HPDF_INT HVar3;
  HPDF_Dict dict;
  undefined4 *s;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  HPDF_STATUS HVar6;
  long lVar7;
  HPDF_Dict p_Var8;
  HPDF_Array array;
  HPDF_Font obj;
  undefined4 uVar9;
  HPDF_Error error;
  
  dict = HPDF_Dict_New(mmgr);
  if (dict == (HPDF_Dict)0x0) {
    return (HPDF_Font)0x0;
  }
  pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
  *pbVar1 = *pbVar1 | 1;
  if (encoder->type == HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
    if (fontdef->type - HPDF_FONTDEF_TYPE_TRUETYPE < 2) {
      s = (undefined4 *)HPDF_GetMem(mmgr,0x58);
      if (s == (undefined4 *)0x0) {
        HPDF_Dict_Free(dict);
        return (HPDF_Font)0x0;
      }
      pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
      *pbVar1 = *pbVar1 | 1;
      dict->write_fn = (HPDF_Dict_OnWriteFunc)0x0;
      dict->free_fn = OnFree_Func;
      dict->attr = s;
      pvVar2 = encoder->attr;
      HPDF_MemSet(s,'\0',0x58);
      s[1] = *(undefined4 *)((long)pvVar2 + 0x40118);
      *(code **)(s + 2) = TextWidth;
      *(code **)(s + 4) = MeasureText;
      *(HPDF_FontDef_conflict *)(s + 6) = fontdef;
      *(HPDF_Encoder *)(s + 8) = encoder;
      *(HPDF_Xref *)(s + 0xe) = xref;
      HVar4 = HPDF_Xref_Add(xref,dict);
      if (HVar4 == 0) {
        HVar4 = HPDF_Dict_AddName(dict,"Type","Font");
        HVar5 = HPDF_Dict_AddName(dict,"BaseFont",fontdef->base_font);
        HVar6 = HPDF_Dict_AddName(dict,"Subtype","Type0");
        lVar7 = HVar6 + HVar5 + HVar4;
        if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
          HVar4 = HPDF_Dict_AddName(dict,"Encoding",encoder->name);
          lVar7 = HVar4 + lVar7;
        }
        else {
          HVar3 = HPDF_StrCmp((char *)((long)pvVar2 + 0x4019c),"Identity-H");
          if (HVar3 == 0) {
            HVar4 = HPDF_Dict_AddName(dict,"Encoding","Identity-H");
            p_Var8 = CreateCMap(encoder,xref);
            *(HPDF_Dict *)(s + 0x14) = p_Var8;
            if (p_Var8 == (HPDF_Dict)0x0) {
              return (HPDF_Font)0x0;
            }
            HVar5 = HPDF_Dict_Add(dict,"ToUnicode",p_Var8);
            lVar7 = HVar5 + HVar4 + lVar7;
          }
          else {
            p_Var8 = CreateCMap(encoder,xref);
            *(HPDF_Dict *)(s + 0x14) = p_Var8;
            if (p_Var8 == (HPDF_Dict)0x0) {
              return (HPDF_Font)0x0;
            }
            HVar4 = HPDF_Dict_Add(dict,"Encoding",p_Var8);
            lVar7 = HVar4 + lVar7;
          }
        }
        if (((lVar7 == 0) && (array = HPDF_Array_New(mmgr), array != (HPDF_Array)0x0)) &&
           (HVar4 = HPDF_Dict_Add(dict,"DescendantFonts",array), HVar4 == 0)) {
          if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
            obj = CIDFontType0_New(dict,xref);
            uVar9 = 3;
          }
          else {
            obj = CIDFontType2_New(dict,xref);
            uVar9 = 4;
          }
          *(HPDF_Font *)(s + 0x10) = obj;
          *s = uVar9;
          if (obj != (HPDF_Font)0x0) {
            HVar4 = HPDF_Array_Add(array,obj);
            if (HVar4 == 0) {
              return dict;
            }
            return (HPDF_Font)0x0;
          }
        }
        return (HPDF_Font)0x0;
      }
      return (HPDF_Font)0x0;
    }
    error = dict->error;
    HVar4 = 0x102e;
  }
  else {
    error = dict->error;
    HVar4 = 0x1028;
  }
  HPDF_SetError(error,HVar4,0);
  return (HPDF_Font)0x0;
}

Assistant:

HPDF_Font
HPDF_Type0Font_New  (HPDF_MMgr        mmgr,
                     HPDF_FontDef     fontdef,
                     HPDF_Encoder     encoder,
                     HPDF_Xref        xref)
{
    HPDF_Dict font;
    HPDF_FontAttr attr;
    HPDF_CMapEncoderAttr encoder_attr;
    HPDF_STATUS ret = 0;
    HPDF_Array descendant_fonts;

    HPDF_PTRACE ((" HPDF_Type0Font_New\n"));

    font = HPDF_Dict_New (mmgr);
    if (!font)
        return NULL;

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;

    /* check whether the fontdef object and the encoder object is valid. */
    if (encoder->type != HPDF_ENCODER_TYPE_DOUBLE_BYTE) {
        HPDF_SetError(font->error, HPDF_INVALID_ENCODER_TYPE, 0);
        return NULL;
    }

    if (fontdef->type != HPDF_FONTDEF_TYPE_CID &&
        fontdef->type != HPDF_FONTDEF_TYPE_TRUETYPE) {
        HPDF_SetError(font->error, HPDF_INVALID_FONTDEF_TYPE, 0);
        return NULL;
    }

    attr = HPDF_GetMem (mmgr, sizeof(HPDF_FontAttr_Rec));
    if (!attr) {
        HPDF_Dict_Free (font);
        return NULL;
    }

    font->header.obj_class |= HPDF_OSUBCLASS_FONT;
    font->write_fn = NULL;
    font->free_fn = OnFree_Func;
    font->attr = attr;

    encoder_attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_MemSet (attr, 0, sizeof(HPDF_FontAttr_Rec));

    attr->writing_mode = encoder_attr->writing_mode;
    attr->text_width_fn = TextWidth;
    attr->measure_text_fn = MeasureText;
    attr->fontdef = fontdef;
    attr->encoder = encoder;
    attr->xref = xref;

    if (HPDF_Xref_Add (xref, font) != HPDF_OK)
        return NULL;

    ret += HPDF_Dict_AddName (font, "Type", "Font");
    ret += HPDF_Dict_AddName (font, "BaseFont", fontdef->base_font);
    ret += HPDF_Dict_AddName (font, "Subtype", "Type0");

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        ret += HPDF_Dict_AddName (font, "Encoding", encoder->name);
    } else {
        /*
	 * Handle the Unicode encoding, see hpdf_encoding_utf.c For some
	 * reason, xpdf-based readers cannot deal with our cmap but work
	 * fine when using the predefined "Identity-H"
	 * encoding. However, text selection does not work, unless we
	 * add a ToUnicode cmap. This CMap should also be "Identity",
	 * but that does not work -- specifying our cmap as a stream however
	 * does work. Who can understand that ?
	 */
        if (HPDF_StrCmp(encoder_attr->ordering, "Identity-H") == 0) {
	    ret += HPDF_Dict_AddName (font, "Encoding", "Identity-H");
	    attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "ToUnicode", attr->cmap_stream);
	    } else
	        return NULL;
	} else {
            attr->cmap_stream = CreateCMap (encoder, xref);

	    if (attr->cmap_stream) {
	        ret += HPDF_Dict_Add (font, "Encoding", attr->cmap_stream);
	    } else
	      return NULL;
	}
    }

    if (ret != HPDF_OK)
        return NULL;

    descendant_fonts = HPDF_Array_New (mmgr);
    if (!descendant_fonts)
        return NULL;

    if (HPDF_Dict_Add (font, "DescendantFonts", descendant_fonts) != HPDF_OK)
        return NULL;

    if (fontdef->type == HPDF_FONTDEF_TYPE_CID) {
        attr->descendant_font = CIDFontType0_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_CID;
    } else {
        attr->descendant_font = CIDFontType2_New (font, xref);
        attr->type = HPDF_FONT_TYPE0_TT;
    }

    if (!attr->descendant_font)
        return NULL;
    else
        if (HPDF_Array_Add (descendant_fonts, attr->descendant_font) !=
                HPDF_OK)
            return NULL;

    return font;
}